

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_zeropage_instructions.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_3bbc00::CpuZeropageTest::run_readwrite_instruction
          (CpuZeropageTest *this,uint8_t instruction,uint8_t new_memory_content)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  CpuRegisters *pCVar1;
  uchar uVar2;
  uint16_t uVar3;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar4;
  ActionInterface<unsigned_char_(unsigned_short)> *pAVar5;
  char cVar6;
  _func_int *message;
  AssertionResult gtest_ar;
  _Any_data local_b0;
  code *local_a0;
  MatcherBase<unsigned_char> local_90;
  uchar *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_68 [8];
  MatcherBase<unsigned_char> local_60;
  MatcherBase<unsigned_short> local_48;
  
  uVar3 = *(uint16_t *)&(this->super_CpuTest).field_0x112;
  (this->super_CpuTest).expected.pc = uVar3;
  (this->super_CpuTest).registers.pc = uVar3;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,instruction);
  pCVar1 = &(this->super_CpuTest).expected;
  pCVar1->pc = pCVar1->pc + 1;
  this_00 = &(this->super_CpuTest).mmu;
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_90,*(short *)&(this->super_CpuTest).field_0x112 + 1);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_90);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_zeropage_instructions.cpp"
                      ,0x2f,"mmu","read_byte(start_pc + 1)");
  uVar2 = (this->super_CpuTest).field_0x115;
  local_78 = (uchar *)operator_new(1);
  *local_78 = uVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<unsigned_char*>
            (&local_70,local_78);
  pAVar5 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a11a0;
  uVar2 = *local_78;
  *(uchar *)&pAVar5[1]._vptr_ActionInterface = uVar2;
  *(uchar *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = uVar2;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_b0,pAVar5);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar4,(Action<unsigned_char_(unsigned_short)> *)&local_b0);
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,3);
  }
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_68)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_90);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_90,(ushort)(byte)(this->super_CpuTest).field_0x115);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_90);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_zeropage_instructions.cpp"
                      ,0x31,"mmu","read_byte(effective_address)");
  uVar2 = (this->super_CpuTest).field_0x114;
  local_78 = (uchar *)operator_new(1);
  *local_78 = uVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<unsigned_char*>
            (&local_70,local_78);
  pAVar5 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a11a0;
  uVar2 = *local_78;
  *(uchar *)&pAVar5[1]._vptr_ActionInterface = uVar2;
  *(uchar *)((long)&pAVar5[1]._vptr_ActionInterface + 1) = uVar2;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_b0,pAVar5);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar4,(Action<unsigned_char_(unsigned_short)> *)&local_b0);
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,3);
  }
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_68)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_90);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_b0,(ushort)(byte)(this->super_CpuTest).field_0x115);
  testing::Matcher<unsigned_char>::Matcher
            ((Matcher<unsigned_char> *)&local_90,(this->super_CpuTest).field_0x114);
  n_e_s::core::test::MockMmu::gmock_write_byte
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_68,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_b0,(Matcher<unsigned_char> *)&local_90);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_zeropage_instructions.cpp"
             ,0x34,"mmu","write_byte(effective_address, memory_content)");
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &(((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_68)->matchers_).
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
              .super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase
            ((MatcherBase<unsigned_char> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_68)->matchers_);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase(&local_90);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_b0);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_b0,(ushort)(byte)(this->super_CpuTest).field_0x115);
  testing::Matcher<unsigned_char>::Matcher((Matcher<unsigned_char> *)&local_90,new_memory_content);
  n_e_s::core::test::MockMmu::gmock_write_byte
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_68,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_b0,(Matcher<unsigned_char> *)&local_90);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_zeropage_instructions.cpp"
             ,0x35,"mmu","write_byte(effective_address, new_memory_content)");
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &(((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_68)->matchers_).
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
              .super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase
            ((MatcherBase<unsigned_char> *)
             &((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_68)->matchers_);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase(&local_90);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&local_b0);
  cVar6 = '\x05';
  do {
    (*(((this->super_CpuTest).cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar6 = cVar6 + -1;
  } while (cVar6 != '\0');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_68,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  if (local_68[0] == '\0') {
    testing::Message::Message((Message *)&local_b0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x247c3a;
    }
    else {
      message = *local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_zeropage_instructions.cpp"
               ,0x38,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((long *)local_b0._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_b0._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<void_(unsigned_short,_unsigned_char)> *)local_68)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

void run_readwrite_instruction(uint8_t instruction,
            uint8_t new_memory_content) {
        registers.pc = expected.pc = start_pc;
        stage_instruction(instruction);
        expected.pc += 1;

        EXPECT_CALL(mmu, read_byte(start_pc + 1))
                .WillOnce(Return(effective_address));
        EXPECT_CALL(mmu, read_byte(effective_address))
                .WillOnce(Return(memory_content));
        // Dummy write
        EXPECT_CALL(mmu, write_byte(effective_address, memory_content));
        EXPECT_CALL(mmu, write_byte(effective_address, new_memory_content));
        step_execution(5);

        EXPECT_EQ(expected, registers);
    }